

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

undefined8 __thiscall tonk::ErrorResult::ToJson_abi_cxx11_(ErrorResult *this)

{
  ostream *poVar1;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  string local_258 [16];
  string *in_stack_fffffffffffffdb8;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"{ \"source\": ");
  JsonValue<char_const*>((char *)in_stack_fffffffffffffdb8);
  std::operator<<(poVar1,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  poVar1 = std::operator<<((ostream *)local_188,", \"description\": ");
  std::__cxx11::string::string(local_1f8,(string *)(in_RSI + 8));
  JsonValue<std::__cxx11::string>(in_stack_fffffffffffffdb8);
  std::operator<<(poVar1,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_1f8);
  poVar1 = std::operator<<((ostream *)local_188,", \"error_type\": ");
  ErrorTypeToString(*(ErrorType *)(in_RSI + 0x28));
  JsonValue<char_const*>((char *)in_stack_fffffffffffffdb8);
  std::operator<<(poVar1,local_218);
  std::__cxx11::string::~string(local_218);
  if (*(int *)(in_RSI + 0x28) == 0) {
    poVar1 = std::operator<<((ostream *)local_188,", \"error_code\": ");
    tonk_result_to_string(*(TonkResult *)(in_RSI + 0x30));
    JsonValue<char_const*>((char *)in_stack_fffffffffffffdb8);
    std::operator<<(poVar1,local_238);
    std::__cxx11::string::~string(local_238);
  }
  else {
    poVar1 = std::operator<<((ostream *)local_188,", \"error_code\": ");
    JsonValue<long>((long)poVar1);
    std::operator<<(poVar1,local_258);
    std::__cxx11::string::~string(local_258);
  }
  std::operator<<((ostream *)local_188," }");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string ErrorResult::ToJson() const
{
    std::ostringstream oss;
    oss << "{ \"source\": " << JsonValue(Source);
    oss << ", \"description\": " << JsonValue(Description);
    oss << ", \"error_type\": " << JsonValue(ErrorTypeToString(Type));
    if (Type == ErrorType::Tonk)
        oss << ", \"error_code\": " << JsonValue(tonk_result_to_string((TonkResult)Code));
    else
        oss << ", \"error_code\": " << JsonValue(Code);
    oss << " }";
    return oss.str();
}